

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlAutomataStatePtr
xmlAutomataNewCounterTrans
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,int counter)

{
  xmlAutomataStatePtr target;
  
  if (counter < 0 || (from == (xmlAutomataStatePtr)0x0 || am == (xmlAutomataPtr)0x0)) {
    return (xmlAutomataStatePtr)0x0;
  }
  target = to;
  if (to == (xmlAutomataStatePtr)0x0) {
    target = xmlRegStatePush(am);
    if (target == (xmlRegStatePtr)0x0) goto LAB_0017f5d7;
    am->state = target;
  }
  xmlRegStateAddTrans(am,from,(xmlRegAtomPtr)0x0,target,-1,counter);
LAB_0017f5d7:
  if (to == (xmlAutomataStatePtr)0x0) {
    to = am->state;
  }
  return to;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewCounterTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
		xmlAutomataStatePtr to, int counter) {
    if ((am == NULL) || (from == NULL) || (counter < 0))
	return(NULL);
    xmlFAGenerateCountedTransition(am, from, to, counter);
    if (to == NULL)
	return(am->state);
    return(to);
}